

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::TextureCube::TextureCube(TextureCube *this,deUint32 name)

{
  long lVar1;
  
  rc::Texture::Texture(&this->super_Texture,name,TYPE_CUBE_MAP);
  (this->super_Texture).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__TextureCube_01e78cf8;
  lVar1 = 0;
  do {
    TextureLevelArray::TextureLevelArray
              ((TextureLevelArray *)((long)&this->m_levels[0].m_data[0].m_ptr + lVar1));
    lVar1 = lVar1 + 0x540;
  } while (lVar1 != 0x1f80);
  tcu::TextureCubeView::TextureCubeView(&this->m_view);
  return;
}

Assistant:

TextureCube::TextureCube (deUint32 name)
	: Texture(name, TYPE_CUBE_MAP)
{
}